

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O0

void container_printf_as_uint32_array(container_t *c,uint8_t typecode,uint32_t base)

{
  container_t *pcVar1;
  undefined4 in_EDX;
  undefined1 in_SIL;
  container_t *in_RDI;
  run_container_t *unaff_retaddr;
  undefined3 in_stack_0000000c;
  undefined3 in_stack_fffffffffffffff4;
  uint uVar2;
  
  uVar2 = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  pcVar1 = container_unwrap_shared(in_RDI,&stack0xfffffffffffffff7);
  if (uVar2 >> 0x18 == 1) {
    bitset_container_printf_as_uint32_array((bitset_container_t *)c,_in_stack_0000000c);
  }
  else if (uVar2 >> 0x18 == 2) {
    array_container_printf_as_uint32_array((array_container_t *)CONCAT44(uVar2,in_EDX),2);
  }
  else {
    run_container_printf_as_uint32_array(unaff_retaddr,(uint32_t)((ulong)pcVar1 >> 0x20));
  }
  return;
}

Assistant:

void container_printf_as_uint32_array(const container_t *c, uint8_t typecode,
                                      uint32_t base) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_printf_as_uint32_array(const_CAST_bitset(c), base);
            return;
        case ARRAY_CONTAINER_TYPE:
            array_container_printf_as_uint32_array(const_CAST_array(c), base);
            return;
        case RUN_CONTAINER_TYPE:
            run_container_printf_as_uint32_array(const_CAST_run(c), base);
            return;
        default:
            roaring_unreachable;
    }
}